

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O2

void do_cmd_lazymove_delay(char *name,wchar_t unused)

{
  byte bVar1;
  _Bool _Var2;
  uint in_EAX;
  char *str;
  ulong uVar3;
  ulong uVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uStack_28;
  char tmp [4];
  
  uStack_28 = (ulong)in_EAX;
  strnfmt(tmp,4,"%i",(ulong)(player->opts).lazymove_delay,in_R8,in_R9,uStack_28);
  screen_save();
  prt("",L'\x13',L'\0');
  prt("Command: Movement Delay Factor",L'\x14',L'\0');
  prt("New movement delay: ",L'\x15',L'\0');
  bVar1 = (player->opts).lazymove_delay;
  str = format("Current movement delay: %d (%d msec)",(ulong)bVar1,(ulong)((uint)bVar1 * 10));
  prt(str,L'\x16',L'\0');
  prt("",L'\x17',L'\0');
  _Var2 = askfor_aux(tmp,4,askfor_aux_numbers);
  if (_Var2) {
    uVar3 = strtoul(tmp,(char **)0x0,0);
    uVar4 = 0xff;
    if (uVar3 < 0xff) {
      uVar4 = uVar3;
    }
    (player->opts).lazymove_delay = (uint8_t)uVar4;
  }
  screen_load();
  return;
}

Assistant:

static void do_cmd_lazymove_delay(const char *name, int unused)
{
	bool res;
	char tmp[4] = "";

	strnfmt(tmp, sizeof(tmp), "%i", player->opts.lazymove_delay);

	screen_save();

	/* Prompt */
	prt("", 19, 0);
	prt("Command: Movement Delay Factor", 20, 0);
	prt("New movement delay: ", 21, 0);
	prt(format("Current movement delay: %d (%d msec)",
		player->opts.lazymove_delay, player->opts.lazymove_delay * 10),
		22, 0);
	prt("", 23, 0);

	/* Ask the user for a string */
	res = askfor_aux(tmp, sizeof(tmp), askfor_aux_numbers);

	/* Process input */
	if (res) {
		unsigned long delay = strtoul(tmp, NULL, 0);
		player->opts.lazymove_delay = (uint8_t) MIN(delay, 255);
	}

	screen_load();
}